

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall booster::locale::impl_icu::num_parse<wchar_t>::~num_parse(num_parse<wchar_t> *this)

{
  num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>> *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__num_parse_002eb378;
  std::__cxx11::string::~string((string *)(in_RDI + 0xf0));
  icu_70::Locale::~Locale((Locale *)(in_RDI + 0x10));
  std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::~num_get
            (in_RDI);
  return;
}

Assistant:

num_parse(cdata const &d,size_t refs = 0) : 
        std::num_get<CharType>(refs),
        loc_(d.locale),
        enc_(d.encoding)
    {
    }